

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O3

void google::protobuf::TestUtil::ModifyRepeatedExtensions<proto2_unittest::TestAllExtensions>
               (TestAllExtensions *message)

{
  int iVar1;
  bool bVar2;
  string *psVar3;
  MessageLite *pMVar4;
  undefined8 extraout_RAX;
  anon_union_32_1_493b367e_for_TestAllExtensions_3 *this;
  long *local_68;
  long local_60;
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  this = &message->field_0;
  protobuf::internal::ExtensionSet::SetRepeatedInt32
            (&(this->_impl_)._extensions_,proto2_unittest::repeated_int32_extension,1,0x1f5);
  protobuf::internal::ExtensionSet::SetRepeatedInt64
            (&(this->_impl_)._extensions_,proto2_unittest::repeated_int64_extension,1,0x1f6);
  protobuf::internal::ExtensionSet::SetRepeatedUInt32
            (&(this->_impl_)._extensions_,proto2_unittest::repeated_uint32_extension,1,0x1f7);
  protobuf::internal::ExtensionSet::SetRepeatedUInt64
            (&(this->_impl_)._extensions_,proto2_unittest::repeated_uint64_extension,1,0x1f8);
  protobuf::internal::ExtensionSet::SetRepeatedInt32
            (&(this->_impl_)._extensions_,proto2_unittest::repeated_sint32_extension,1,0x1f9);
  protobuf::internal::ExtensionSet::SetRepeatedInt64
            (&(this->_impl_)._extensions_,proto2_unittest::repeated_sint64_extension,1,0x1fa);
  protobuf::internal::ExtensionSet::SetRepeatedUInt32
            (&(this->_impl_)._extensions_,(int)proto2_unittest::repeated_fixed32_extension,1,0x1fb);
  protobuf::internal::ExtensionSet::SetRepeatedUInt64
            (&(this->_impl_)._extensions_,proto2_unittest::repeated_fixed64_extension,1,0x1fc);
  protobuf::internal::ExtensionSet::SetRepeatedInt32
            (&(this->_impl_)._extensions_,proto2_unittest::repeated_sfixed32_extension,1,0x1fd);
  protobuf::internal::ExtensionSet::SetRepeatedInt64
            (&(this->_impl_)._extensions_,proto2_unittest::repeated_sfixed64_extension,1,0x1fe);
  protobuf::internal::ExtensionSet::SetRepeatedFloat
            (&(this->_impl_)._extensions_,(int)proto2_unittest::repeated_float_extension,1,511.0);
  protobuf::internal::ExtensionSet::SetRepeatedDouble
            (&(this->_impl_)._extensions_,proto2_unittest::repeated_double_extension,1,512.0);
  protobuf::internal::ExtensionSet::SetRepeatedBool
            (&(this->_impl_)._extensions_,proto2_unittest::repeated_bool_extension,1,true);
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"515","");
  iVar1 = proto2_unittest::repeated_string_extension;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>((string *)local_48,local_68,local_60 + (long)local_68);
  psVar3 = protobuf::internal::ExtensionSet::MutableRepeatedString_abi_cxx11_
                     (&(this->_impl_)._extensions_,iVar1,1);
  std::__cxx11::string::operator=((string *)psVar3,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"516","");
  iVar1 = proto2_unittest::repeated_bytes_extension;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>((string *)local_48,local_68,local_60 + (long)local_68);
  psVar3 = protobuf::internal::ExtensionSet::MutableRepeatedString_abi_cxx11_
                     (&(this->_impl_)._extensions_,iVar1,1);
  std::__cxx11::string::operator=((string *)psVar3,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  pMVar4 = protobuf::internal::ExtensionSet::MutableRepeatedMessage
                     (&(this->_impl_)._extensions_,proto2_unittest::repeatedgroup_extension,1);
  *(undefined4 *)&pMVar4[1]._internal_metadata_.ptr_ = 0x205;
  *(byte *)&pMVar4[1]._vptr_MessageLite = *(byte *)&pMVar4[1]._vptr_MessageLite | 1;
  pMVar4 = protobuf::internal::ExtensionSet::MutableRepeatedMessage
                     (&(this->_impl_)._extensions_,
                      proto2_unittest::repeated_nested_message_extension,1);
  *(undefined4 *)&pMVar4[1]._internal_metadata_.ptr_ = 0x206;
  *(byte *)&pMVar4[1]._vptr_MessageLite = *(byte *)&pMVar4[1]._vptr_MessageLite | 1;
  pMVar4 = protobuf::internal::ExtensionSet::MutableRepeatedMessage
                     (&(this->_impl_)._extensions_,
                      proto2_unittest::repeated_foreign_message_extension,1);
  *(undefined4 *)&pMVar4[1]._internal_metadata_.ptr_ = 0x207;
  *(byte *)&pMVar4[1]._vptr_MessageLite = *(byte *)&pMVar4[1]._vptr_MessageLite | 1;
  pMVar4 = protobuf::internal::ExtensionSet::MutableRepeatedMessage
                     (&(this->_impl_)._extensions_,
                      proto2_unittest::repeated_import_message_extension,1);
  *(undefined4 *)&pMVar4[1]._internal_metadata_.ptr_ = 0x208;
  *(byte *)&pMVar4[1]._vptr_MessageLite = *(byte *)&pMVar4[1]._vptr_MessageLite | 1;
  pMVar4 = protobuf::internal::ExtensionSet::MutableRepeatedMessage
                     (&(this->_impl_)._extensions_,proto2_unittest::repeated_lazy_message_extension,
                      1);
  *(undefined4 *)&pMVar4[1]._internal_metadata_.ptr_ = 0x20f;
  *(byte *)&pMVar4[1]._vptr_MessageLite = *(byte *)&pMVar4[1]._vptr_MessageLite | 1;
  iVar1 = proto2_unittest::repeated_nested_enum_extension;
  bVar2 = protobuf::internal::ValidateEnum
                    (1,(uint32_t *)proto2_unittest::TestAllTypes_NestedEnum_internal_data_);
  if (bVar2) {
    protobuf::internal::ExtensionSet::SetRepeatedEnum(&(this->_impl_)._extensions_,iVar1,1,1);
    iVar1 = proto2_unittest::repeated_foreign_enum_extension;
    bVar2 = protobuf::internal::ValidateEnum
                      (4,(uint32_t *)proto2_unittest::ForeignEnum_internal_data_);
    if (bVar2) {
      protobuf::internal::ExtensionSet::SetRepeatedEnum(&(this->_impl_)._extensions_,iVar1,1,4);
      iVar1 = proto2_unittest::repeated_import_enum_extension;
      bVar2 = protobuf::internal::ValidateEnum
                        (7,(uint32_t *)&proto2_unittest_import::ImportEnum_internal_data_);
      if (bVar2) {
        protobuf::internal::ExtensionSet::SetRepeatedEnum(&(this->_impl_)._extensions_,iVar1,1,7);
        local_68 = local_58;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"524","");
        iVar1 = proto2_unittest::repeated_string_piece_extension;
        local_48[0] = local_38;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_48,local_68,local_60 + (long)local_68);
        psVar3 = protobuf::internal::ExtensionSet::MutableRepeatedString_abi_cxx11_
                           (&(this->_impl_)._extensions_,iVar1,1);
        std::__cxx11::string::operator=((string *)psVar3,(string *)local_48);
        if (local_48[0] != local_38) {
          operator_delete(local_48[0],local_38[0] + 1);
        }
        if (local_68 != local_58) {
          operator_delete(local_68,local_58[0] + 1);
        }
        local_68 = local_58;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"525","");
        iVar1 = proto2_unittest::repeated_cord_extension;
        local_48[0] = local_38;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_48,local_68,local_60 + (long)local_68);
        psVar3 = protobuf::internal::ExtensionSet::MutableRepeatedString_abi_cxx11_
                           (&(this->_impl_)._extensions_,iVar1,1);
        std::__cxx11::string::operator=((string *)psVar3,(string *)local_48);
        if (local_48[0] != local_38) {
          operator_delete(local_48[0],local_38[0] + 1);
        }
        if (local_68 != local_58) {
          operator_delete(local_68,local_58[0] + 1);
        }
        return;
      }
      goto LAB_006c14bc;
    }
  }
  else {
    ModifyRepeatedExtensions<proto2_unittest::TestAllExtensions>((TestUtil *)local_48);
  }
  ModifyRepeatedExtensions<proto2_unittest::TestAllExtensions>((TestUtil *)local_48);
LAB_006c14bc:
  ModifyRepeatedExtensions<proto2_unittest::TestAllExtensions>((TestUtil *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void ModifyRepeatedExtensions(TestAllExtensions* message) {
  using Traits = TestUtilTraits<TestAllExtensions>;
  message->SetExtension(Traits::repeated_int32_extension, 1, 501);
  message->SetExtension(Traits::repeated_int64_extension, 1, 502);
  message->SetExtension(Traits::repeated_uint32_extension, 1, 503);
  message->SetExtension(Traits::repeated_uint64_extension, 1, 504);
  message->SetExtension(Traits::repeated_sint32_extension, 1, 505);
  message->SetExtension(Traits::repeated_sint64_extension, 1, 506);
  message->SetExtension(Traits::repeated_fixed32_extension, 1, 507);
  message->SetExtension(Traits::repeated_fixed64_extension, 1, 508);
  message->SetExtension(Traits::repeated_sfixed32_extension, 1, 509);
  message->SetExtension(Traits::repeated_sfixed64_extension, 1, 510);
  message->SetExtension(Traits::repeated_float_extension, 1, 511);
  message->SetExtension(Traits::repeated_double_extension, 1, 512);
  message->SetExtension(Traits::repeated_bool_extension, 1, true);
  message->SetExtension(Traits::repeated_string_extension, 1, "515");
  message->SetExtension(Traits::repeated_bytes_extension, 1, "516");

  message->MutableExtension(Traits::repeatedgroup_extension, 1)->set_a(517);
  message->MutableExtension(Traits::repeated_nested_message_extension, 1)
      ->set_bb(518);
  message->MutableExtension(Traits::repeated_foreign_message_extension, 1)
      ->set_c(519);
  message->MutableExtension(Traits::repeated_import_message_extension, 1)
      ->set_d(520);
  message->MutableExtension(Traits::repeated_lazy_message_extension, 1)
      ->set_bb(527);

  message->SetExtension(Traits::repeated_nested_enum_extension, 1,
                        Traits::TestAllTypes::FOO);
  message->SetExtension(Traits::repeated_foreign_enum_extension, 1,
                        Traits::FOREIGN_FOO);
  message->SetExtension(Traits::repeated_import_enum_extension, 1,
                        Traits::IMPORT_FOO);

  message->SetExtension(Traits::repeated_string_piece_extension, 1, "524");
  message->SetExtension(Traits::repeated_cord_extension, 1, "525");
}